

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  basic_format_specs<wchar_t> *spec;
  uint uVar2;
  int num_digits;
  uint uVar3;
  bin_writer<1> bVar4;
  bin_writer<1> f;
  string_view prefix;
  
  spec = this->spec;
  if (((spec->super_core_format_specs).flags & 8) != 0) {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = (spec->super_core_format_specs).type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  uVar2 = this->abs_value;
  bVar4.num_digits = 0;
  bVar4.abs_value = uVar2;
  num_digits = 0;
  f = bVar4;
  do {
    f = (bin_writer<1>)((long)f + 0x100000000);
    num_digits = num_digits + 1;
    uVar2 = uVar2 >> 1;
    uVar3 = bVar4.abs_value;
    bVar4.num_digits = 0;
    bVar4.abs_value = uVar2;
  } while (1 < uVar3);
  prefix.data_ = this->prefix;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
  ::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              *)this->writer,num_digits,prefix,spec,f);
  return;
}

Assistant:

void on_bin() {
      if (spec.has(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type);
      }
      int num_digits = count_digits<1>();
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<1>{abs_value, num_digits});
    }